

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instancenorm.cpp
# Opt level: O2

int __thiscall ncnn::InstanceNorm::load_model(InstanceNorm *this,ModelBin *mb)

{
  Mat MStack_68;
  
  (*mb->_vptr_ModelBin[2])(&MStack_68,mb,(ulong)(uint)this->channels,1);
  Mat::operator=(&this->gamma_data,&MStack_68);
  Mat::~Mat(&MStack_68);
  if (((this->gamma_data).data != (void *)0x0) &&
     ((long)(this->gamma_data).c * (this->gamma_data).cstep != 0)) {
    (*mb->_vptr_ModelBin[2])(&MStack_68,mb,(ulong)(uint)this->channels,1);
    Mat::operator=(&this->beta_data,&MStack_68);
    Mat::~Mat(&MStack_68);
    if (((this->beta_data).data != (void *)0x0) &&
       ((long)(this->beta_data).c * (this->beta_data).cstep != 0)) {
      return 0;
    }
  }
  return -100;
}

Assistant:

int InstanceNorm::load_model(const ModelBin& mb)
{
    gamma_data = mb.load(channels, 1);
    if (gamma_data.empty())
        return -100;

    beta_data = mb.load(channels, 1);
    if (beta_data.empty())
        return -100;

    return 0;
}